

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint __thiscall
ON_SubD::GetMarkedComponents
          (ON_SubD *this,bool bAddMarkedComponents,ON__UINT8 mark_bits,bool bIncludeVertices,
          bool bIncludeEdges,bool bIncludeFaces,ON_SimpleArray<ON_SubDComponentPtr> *component_list)

{
  bool bVar1;
  bool bVar2;
  ON_SubDComponentPtr local_108;
  ON_SubDFace *local_100;
  ON_SubDFace *f;
  ON_SubDFaceIterator fit;
  ON_SubDEdge *local_b8;
  ON_SubDEdge *e;
  ON_SubDEdgeIterator eit;
  ON_SubDVertex *local_60;
  ON_SubDVertex *v;
  ON_SubDVertexIterator vit;
  uint mark_count;
  bool bIncludeFaces_local;
  bool bIncludeEdges_local;
  bool bIncludeVertices_local;
  ON__UINT8 mark_bits_local;
  bool bAddMarkedComponents_local;
  ON_SubD *this_local;
  
  bVar1 = (bool)(-bAddMarkedComponents & 1);
  vit.m_component_ptr.m_ptr._4_4_ = 0;
  if (bIncludeVertices) {
    ON_SubDVertexIterator::ON_SubDVertexIterator((ON_SubDVertexIterator *)&v,this);
    local_60 = ON_SubDVertexIterator::FirstVertex((ON_SubDVertexIterator *)&v);
    while (local_60 != (ON_SubDVertex *)0x0) {
      bVar2 = ON_ComponentStatus::IsMarked
                        (&(local_60->super_ON_SubDComponentBase).m_status,mark_bits);
      if (bVar1 == bVar2) {
        eit.m_component_ptr = ON_SubDVertex::ComponentPtr(local_60);
        ON_SimpleArray<ON_SubDComponentPtr>::Append(component_list,&eit.m_component_ptr);
        vit.m_component_ptr.m_ptr._4_4_ = vit.m_component_ptr.m_ptr._4_4_ + 1;
      }
      local_60 = ON_SubDVertexIterator::NextVertex((ON_SubDVertexIterator *)&v);
    }
    ON_SubDVertexIterator::~ON_SubDVertexIterator((ON_SubDVertexIterator *)&v);
  }
  if (bIncludeEdges) {
    ON_SubDEdgeIterator::ON_SubDEdgeIterator((ON_SubDEdgeIterator *)&e,this);
    local_b8 = ON_SubDEdgeIterator::FirstEdge((ON_SubDEdgeIterator *)&e);
    while (local_b8 != (ON_SubDEdge *)0x0) {
      bVar2 = ON_ComponentStatus::IsMarked
                        (&(local_b8->super_ON_SubDComponentBase).m_status,mark_bits);
      if (bVar1 == bVar2) {
        fit.m_component_ptr = ON_SubDEdge::ComponentPtr(local_b8);
        ON_SimpleArray<ON_SubDComponentPtr>::Append(component_list,&fit.m_component_ptr);
        vit.m_component_ptr.m_ptr._4_4_ = vit.m_component_ptr.m_ptr._4_4_ + 1;
      }
      local_b8 = ON_SubDEdgeIterator::NextEdge((ON_SubDEdgeIterator *)&e);
    }
    ON_SubDEdgeIterator::~ON_SubDEdgeIterator((ON_SubDEdgeIterator *)&e);
  }
  if (bIncludeFaces) {
    ON_SubDFaceIterator::ON_SubDFaceIterator((ON_SubDFaceIterator *)&f,this);
    local_100 = ON_SubDFaceIterator::FirstFace((ON_SubDFaceIterator *)&f);
    while (local_100 != (ON_SubDFace *)0x0) {
      bVar2 = ON_ComponentStatus::IsMarked
                        (&(local_100->super_ON_SubDComponentBase).m_status,mark_bits);
      if (bVar1 == bVar2) {
        local_108 = ON_SubDFace::ComponentPtr(local_100);
        ON_SimpleArray<ON_SubDComponentPtr>::Append(component_list,&local_108);
        vit.m_component_ptr.m_ptr._4_4_ = vit.m_component_ptr.m_ptr._4_4_ + 1;
      }
      local_100 = ON_SubDFaceIterator::NextFace((ON_SubDFaceIterator *)&f);
    }
    ON_SubDFaceIterator::~ON_SubDFaceIterator((ON_SubDFaceIterator *)&f);
  }
  return vit.m_component_ptr.m_ptr._4_4_;
}

Assistant:

unsigned int ON_SubD::GetMarkedComponents(
  bool bAddMarkedComponents,
  ON__UINT8 mark_bits,
  bool bIncludeVertices,
  bool bIncludeEdges,
  bool bIncludeFaces,
  ON_SimpleArray< ON_SubDComponentPtr >& component_list
) const
{
  bAddMarkedComponents = bAddMarkedComponents ? true : false; // so we can use == on boolean values
  unsigned int mark_count = 0;

  if (bIncludeVertices)
  {
    ON_SubDVertexIterator vit(*this);
    for (const ON_SubDVertex* v = vit.FirstVertex(); nullptr != v; v = vit.NextVertex())
    {
      if (bAddMarkedComponents == v->m_status.IsMarked(mark_bits))
      {
        component_list.Append(v->ComponentPtr());
        mark_count++;
      }
    }
  }

  if (bIncludeEdges)
  {
    ON_SubDEdgeIterator eit(*this);
    for (const ON_SubDEdge* e = eit.FirstEdge(); nullptr != e; e = eit.NextEdge())
    {
      if (bAddMarkedComponents == e->m_status.IsMarked(mark_bits))
      {
        component_list.Append(e->ComponentPtr());
        mark_count++;
      }
    }
  }

  if (bIncludeFaces)
  {
    ON_SubDFaceIterator fit(*this);
    for (const ON_SubDFace* f = fit.FirstFace(); nullptr != f; f = fit.NextFace())
    {
      if (bAddMarkedComponents == f->m_status.IsMarked(mark_bits))
      {
        component_list.Append(f->ComponentPtr());
        mark_count++;
      }
    }
  }

  return mark_count;
}